

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

chunk_conflict * river_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t last_place_00;
  int y;
  uint32_t uVar4;
  uint32_t uVar5;
  feature *pfVar6;
  void *p_00;
  loc_conflict lVar7;
  loc_conflict grid_00;
  loc grid2;
  bool bVar8;
  chunk_conflict *c;
  wchar_t form_feats [7];
  int local_54;
  wchar_t path;
  wchar_t form_grids;
  wchar_t last_place;
  wchar_t place;
  int *mid;
  wchar_t y1;
  wchar_t i;
  loc centre;
  loc grid;
  char **p_error_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  wVar3 = (wchar_t)p->place;
  last_place_00 = (wchar_t)p->last_place;
  local_54 = 0;
  c._0_4_ = FEAT_TREE;
  c._4_4_ = FEAT_PASS_RUBBLE;
  form_feats[0] = FEAT_MAGMA;
  form_feats[1] = FEAT_GRANITE;
  form_feats[2] = FEAT_TREE2;
  form_feats[3] = FEAT_QUARTZ;
  form_feats[4] = FEAT_NONE;
  p_local = (player *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  *(int *)((long)&p_local->class + 4) = (int)p->depth;
  (p_local->grid).x = wVar3;
  y = *(wchar_t *)&p_local->ht / 2;
  centre.x = 0;
  centre.y = 0;
  while (centre.y < *(wchar_t *)&p_local->ht) {
    centre = (loc)((ulong)(uint)centre.y << 0x20);
    while( true ) {
      if (p_local->au <= centre.x) break;
      square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_GRASS);
      centre.x = centre.x + 1;
    }
    centre.y = centre.y + 1;
  }
  alloc_paths((chunk_conflict *)p_local,p,wVar3,last_place_00);
  lVar7.x = (p->grid).x;
  lVar7.y = (p->grid).y;
  pfVar6 = square_feat((chunk *)p_local,lVar7);
  form_feats[6] = pfVar6->fidx;
  set_num_vaults((chunk_conflict *)p_local);
  make_edges((chunk_conflict *)p_local,true,false);
  wVar1 = p_local->au;
  uVar4 = Rand_div(p_local->au / 3);
  mid._4_4_ = wVar1 / 3 + uVar4;
  p_00 = mem_zalloc((long)*(wchar_t *)&p_local->ht << 2);
  centre.x = 0;
  centre.y = 1;
  while (centre.y < *(wchar_t *)&p_local->ht + L'\xffffffff') {
    *(int *)((long)p_00 + (long)centre.y * 4) = mid._4_4_;
    uVar4 = Rand_div(5);
    centre.x = (mid._4_4_ - uVar4) + -10;
    while( true ) {
      uVar4 = Rand_div(5);
      if ((int)(mid._4_4_ + uVar4 + 10) <= centre.x) break;
      square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_WATER);
      square_mark((chunk *)p_local,(loc_conflict)centre);
      centre.x = centre.x + 1;
    }
    uVar4 = Rand_div(3);
    mid._4_4_ = (uVar4 - 1) + mid._4_4_;
    centre.y = centre.y + 1;
  }
  lVar7 = (loc_conflict)loc(*(int *)((long)p_00 + (long)y * 4),y);
  if (world->levels[wVar3].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    if (world->levels[wVar3].locality == LOC_SIRION_VALE) {
      centre = (loc)((ulong)(y - 10) << 0x20);
      while (centre.y < y + 10) {
        centre.x = *(int *)((long)p_00 + (long)centre.y * 4) + -10;
        while( true ) {
          if (*(int *)((long)p_00 + (long)centre.y * 4) + 10 <= centre.x) break;
          wVar3 = distance((loc)lVar7,centre);
          if (wVar3 < L'\x06') {
            square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_GRASS);
          }
          else {
            square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_WATER);
          }
          wVar3 = distance((loc)lVar7,centre);
          if (wVar3 < L'\x02') {
            square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_GRANITE);
          }
          centre.x = centre.x + 1;
        }
        centre.y = centre.y + 1;
      }
      grid_00 = (loc_conflict)loc(*(int *)((long)p_00 + (long)y * 4),y + 1);
      square_set_feat((chunk *)p_local,grid_00,FEAT_CLOSED);
      square_set_feat((chunk *)p_local,lVar7,FEAT_MORE);
      wVar3 = level_topography(last_place_00);
      if (wVar3 == L'\a') {
        player_place((chunk_conflict1 *)p_local,p,(loc)lVar7);
      }
    }
    else {
      grid2 = loc(*(int *)((long)p_00 + (long)y * 4) + -6,y);
      centre = (loc)((ulong)(y - 1) << 0x20);
      while (centre.y < y + 2) {
        centre.x = *(int *)((long)p_00 + (long)y * 4) + -0xf;
        while( true ) {
          if (*(int *)((long)p_00 + (long)y * 4) + -5 <= centre.x) break;
          _Var2 = loc_eq(centre,grid2);
          if (_Var2) {
            square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_MORE);
            wVar3 = level_topography(last_place_00);
            if (wVar3 == L'\a') {
              player_place((chunk_conflict1 *)p_local,p,centre);
            }
          }
          else {
            square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_GRANITE);
          }
          centre.x = centre.x + 1;
        }
        centre.x = *(int *)((long)p_00 + (long)y * 4) + -5;
        while( true ) {
          if (*(int *)((long)p_00 + (long)y * 4) <= centre.x) break;
          square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_ROAD);
          centre.x = centre.x + 1;
        }
        centre.x = *(int *)((long)p_00 + (long)y * 4) + -4;
        while( true ) {
          if (*(int *)((long)p_00 + (long)y * 4) + 5 <= centre.x) break;
          square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_WATER);
          centre.x = centre.x + 1;
        }
        centre.y = centre.y + 1;
      }
    }
  }
  for (; local_54 < *(wchar_t *)((long)&p_local->class + 4) * 0x32 + 1000;
      local_54 = wVar3 + local_54) {
    uVar4 = Rand_div(*(wchar_t *)&p_local->ht + L'\xfffffffe');
    uVar5 = Rand_div(p_local->au + L'\xfffffffe');
    centre.y = uVar4 + 1;
    centre.x = uVar5 + 1;
    wVar3 = make_formation((chunk_conflict *)p_local,p,centre,FEAT_GRASS,FEAT_GRASS,(int *)&c,
                           "River",*(wchar_t *)((long)&p_local->class + 4) / 2);
  }
  centre.x = 0;
  centre.y = 0;
  while (centre.y < *(wchar_t *)&p_local->ht) {
    centre = (loc)((ulong)(uint)centre.y << 0x20);
    while( true ) {
      if (p_local->au <= centre.x) break;
      square_unmark((chunk *)p_local,(loc_conflict)centre);
      centre.x = centre.x + 1;
    }
    centre = (loc)((ulong)(centre.y + 1) << 0x20);
  }
  centre = p->grid;
  while( true ) {
    pfVar6 = square_feat((chunk *)p_local,(loc_conflict)centre);
    bVar8 = true;
    if (pfVar6->fidx != FEAT_WATER) {
      pfVar6 = square_feat((chunk *)p_local,(loc_conflict)centre);
      bVar8 = pfVar6->fidx == FEAT_GRANITE;
    }
    if (!bVar8) break;
    centre.x = centre.x + 1;
  }
  _Var2 = loc_eq(centre,p->grid);
  if (!_Var2) {
    player_place((chunk_conflict1 *)p_local,p,centre);
    square_set_feat((chunk *)p_local,(loc_conflict)centre,form_feats[6]);
    centre.y = (p->grid).y;
    while (0 < centre.y) {
      _Var2 = square_ispassable((chunk *)p_local,(loc_conflict)centre);
      if (!_Var2) {
        square_set_feat((chunk *)p_local,(loc_conflict)centre,FEAT_ROAD);
      }
      centre.y = centre.y + -1;
    }
  }
  populate((chunk_conflict *)p_local,false);
  mem_free(p_00);
  _Var2 = verify_level((chunk_conflict *)p_local);
  if (!_Var2) {
    wipe_mon_list((chunk *)p_local,p);
    cave_free((chunk_conflict *)p_local);
    *p_error = "wilderness level had generation issues";
    p_local = (player *)0x0;
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *river_gen(struct player *p, int height, int width,
						const char **p_error)
{
	struct loc grid, centre;
	int i, y1;
	int *mid;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int path;

	int form_feats[] = { FEAT_TREE, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_TREE2, FEAT_QUARTZ, FEAT_NONE };

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;
	y1 = c->height / 2;

	/* Start with grass */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Remember the path in case it has to move */
	path = square_feat(c, p->grid)->fidx;

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Place the river, start in the middle third */
	i = c->width / 3 + randint0(c->width / 3);
	mid = mem_zalloc(c->height * sizeof(int));
	for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
		/* Remember the midpoint */
		mid[grid.y] = i;

		for (grid.x = i - randint0(5) - 10; grid.x < i + randint0(5) + 10;
			 grid.x++) {
			/* Make the river */
			square_set_feat(c, grid, FEAT_WATER);
			square_mark(c, grid);
		}
		/* Meander */
		i += randint0(3) - 1;
	}

	/* Mark the centre */
	centre = loc(mid[y1], y1);

	/* Special dungeon entrances */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* If we're at Sauron's Isle... */
		if (world->levels[place].locality == LOC_SIRION_VALE) {
			for (grid.y = y1 - 10; grid.y < y1 + 10; grid.y++) {
				for (grid.x = mid[grid.y] - 10; grid.x < mid[grid.y] + 10;
					 grid.x++) {
					if (distance(centre, grid) < 6) {
						/* ...make Tol-In-Gaurhoth... */
						square_set_feat(c, grid, FEAT_GRASS);
					} else {
						/* ...surround it by water... */
						square_set_feat(c, grid, FEAT_WATER);
					}
					/* ...and build the tower... */
					if (distance(centre, grid) < 2)
						square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			/* ...with door and stairs */
			square_set_feat(c, loc(mid[y1], y1 + 1), FEAT_CLOSED);
			square_set_feat(c, centre, FEAT_MORE);
			if (level_topography(last_place) == TOP_CAVE) {
				player_place(c, p, centre);
			}
		} else {
			/* Must be Nargothrond */
			/* This place is hard to get into... */
			centre = loc(mid[y1] - 6, y1);
			for (grid.y = y1 - 1; grid.y < y1 + 2; grid.y++) {
				for (grid.x = mid[y1] - 15; grid.x < mid[y1] - 5; grid.x++) {
					if (loc_eq(grid, centre)) {
						square_set_feat(c, grid, FEAT_MORE);
						if (level_topography(last_place) == TOP_CAVE) {
							player_place(c, p, grid);
						}
					} else {
						square_set_feat(c, grid, FEAT_GRANITE);
					}
				}
				for (grid.x = mid[y1] - 5; grid.x < mid[y1]; grid.x++) {
					square_set_feat(c, grid, FEAT_ROAD);
				}
				for (grid.x = mid[y1] - 4; grid.x < mid[y1] + 5; grid.x++) {
					square_set_feat(c, grid, FEAT_WATER);
				}
			}
		}
	}

	/* Place some formations */
	while (form_grids < 50 * c->depth + 1000) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);

		form_grids += make_formation(c, p, grid, FEAT_GRASS, FEAT_GRASS,
									 form_feats, "River", c->depth / 2);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Move the player out of the river */
	grid = p->grid;
	while ((square_feat(c, grid)->fidx == FEAT_WATER)
		   || (square_feat(c, grid)->fidx == FEAT_GRANITE)) {
		grid.x++;
	}

	/* Place player if they had to move */
	if (!loc_eq(grid, p->grid)) {
		player_place(c, p, grid);
		square_set_feat(c, grid, path);
		for (grid.y = p->grid.y; grid.y > 0; grid.y--) {
			if (!square_ispassable(c, grid)) {
				square_set_feat(c, grid, FEAT_ROAD);
			}
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	mem_free(mid);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}